

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

void __thiscall
testing::internal::
ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::
AddTestPattern(ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>
               *this,char *param_1,char *test_base_name,
              TestMetaFactoryBase<google::protobuf::internal::(anonymous_namespace)::TestParam>
              *meta_factory,CodeLocation *code_location)

{
  pointer *ppsVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__a;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  element_type *peVar2;
  ulong uVar3;
  pointer __result;
  pointer psVar4;
  _Tp_alloc_type *__alloc;
  TestInfo **__args;
  TestInfo **extraout_RDX;
  TestInfo **__args_00;
  size_t __n;
  ulong uVar5;
  ulong uVar6;
  allocator<char> local_71;
  element_type *local_70;
  shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::TestInfo>
  local_68;
  CodeLocation local_58;
  
  peVar2 = (element_type *)operator_new(0x50);
  CodeLocation::CodeLocation(&local_58,(CodeLocation *)meta_factory);
  local_70 = peVar2;
  std::__cxx11::string::string<std::allocator<char>>((string *)peVar2,param_1,&local_71);
  peVar2 = local_70;
  (local_70->test_meta_factory)._M_t.
  super___uniq_ptr_impl<testing::internal::TestMetaFactoryBase<google::protobuf::internal::(anonymous_namespace)::TestParam>,_std::default_delete<testing::internal::TestMetaFactoryBase<google::protobuf::internal::(anonymous_namespace)::TestParam>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<google::protobuf::internal::(anonymous_namespace)::TestParam>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<google::protobuf::internal::(anonymous_namespace)::TestParam>_>_>
  .
  super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<google::protobuf::internal::(anonymous_namespace)::TestParam>_*,_false>
  ._M_head_impl =
       (TestMetaFactoryBase<google::protobuf::internal::(anonymous_namespace)::TestParam> *)
       test_base_name;
  CodeLocation::CodeLocation(&local_70->code_location,&local_58);
  local_68.
  super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = peVar2;
  __a = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        (this->tests_).
        super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::TestInfo>_>_>
        ._M_impl.super__Vector_impl_data._M_finish;
  if (__a == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             (this->tests_).
             super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::TestInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_68.
    super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         (this->tests_).
         super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::TestInfo>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    if ((long)__a -
        (long)local_68.
              super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi == 0x7ffffffffffffff0) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    uVar5 = (long)__a -
            (long)local_68.
                  super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi >> 4;
    uVar3 = 1;
    if (__a != local_68.
               super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi) {
      uVar3 = uVar5;
    }
    uVar6 = uVar3 + uVar5;
    __alloc = (_Tp_alloc_type *)0x7ffffffffffffff;
    if (0x7fffffffffffffe < uVar6) {
      uVar6 = 0x7ffffffffffffff;
    }
    if (CARRY8(uVar3,uVar5)) {
      uVar6 = 0x7ffffffffffffff;
    }
    if (uVar6 == 0) {
      __result = (pointer)0x0;
      __args_00 = __args;
    }
    else {
      __result = (pointer)operator_new(uVar6 << 4);
      __args_00 = extraout_RDX;
    }
    std::
    allocator_traits<std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::TestInfo>>>
    ::
    construct<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::TestInfo>,testing::internal::ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::TestInfo*>
              ((allocator_type *)(__result + uVar5),&local_68,__args_00);
    this_00._M_pi =
         local_68.
         super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    psVar4 = std::
             vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::TestInfo>_>_>
             ::_S_relocate((pointer)local_68.
                                    super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi,(pointer)__a,__result,__alloc);
    psVar4 = std::
             vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::TestInfo>_>_>
             ::_S_relocate((pointer)__a,(pointer)__a,psVar4 + 1,__alloc);
    std::
    _Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::TestInfo>_>_>
    ::_M_deallocate((_Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::TestInfo>_>_>
                     *)this_00._M_pi,
                    (pointer)((long)(this->tests_).
                                    super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::TestInfo>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)this_00._M_pi >> 4),__n);
    (this->tests_).
    super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::TestInfo>_>_>
    ._M_impl.super__Vector_impl_data._M_start = __result;
    (this->tests_).
    super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::TestInfo>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = psVar4;
    (this->tests_).
    super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::TestInfo>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = __result + uVar6;
  }
  else {
    std::
    allocator_traits<std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::TestInfo>>>
    ::
    construct<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::TestInfo>,testing::internal::ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::TestInfo*>
              ((allocator_type *)__a,&local_68,__args);
    ppsVar1 = &(this->tests_).
               super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::TestInfo>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppsVar1 = *ppsVar1 + 1;
  }
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void AddTestPattern(const char*,
                      const char* test_base_name,
                      TestMetaFactoryBase<ParamType>* meta_factory,
                      CodeLocation code_location) {
    tests_.emplace_back(
        new TestInfo(test_base_name, meta_factory, std::move(code_location)));
  }